

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.hpp
# Opt level: O3

VecDoub * __thiscall
Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
::minimize(VecDoub *__return_storage_ptr__,
          Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          *this,VecDoub_I *pp)

{
  VecDoub *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  General_Exception *this_01;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pdVar10;
  pointer pdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  string local_b8;
  undefined1 local_98 [8];
  VecDoub h;
  VecDoub g;
  size_type __n;
  
  dVar1 = (this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).ftol;
  pdVar10 = (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar11 = (pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this,pp);
  uVar7 = (uint)((ulong)((long)pdVar10 - (long)pdVar11) >> 3);
  __n = (size_type)(int)uVar7;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &h.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,(allocator_type *)&local_b8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98,__n,(allocator_type *)&local_b8);
  this_00 = &(this->
             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
             ).xi;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__n);
  g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
                ::operator()((this->
                             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                             ).func,(vector<double,_std::allocator<double>_> *)this);
  LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
  ::df((this->
       super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
       ).func,(vector<double,_std::allocator<double>_> *)this,this_00);
  if (0 < (int)uVar7) {
    pdVar10 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      dVar12 = -pdVar10[uVar8];
      h.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[uVar8] = dVar12;
      *(double *)((long)local_98 + uVar8 * 8) = dVar12;
      pdVar10[uVar8] = dVar12;
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar8);
  }
  uVar8 = (ulong)(uVar7 & 0x7fffffff);
  iVar4 = 0;
  do {
    if (((uint)(iVar4 * -0x3d70a3d7) >> 2 | iVar4 * 0x40000000) < 0x28f5c29) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"#At iteration: ",0xf);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," states are:\n",0xd);
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
      if ((this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          (this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar6 = 0;
        uVar9 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#\t",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = std::ostream::_M_insert<double>
                             ((this->
                              super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                              ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar6]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          bVar3 = uVar9 < (ulong)((long)(this->
                                        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                                        ).p.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                                        ).p.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
          uVar6 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar3);
      }
      std::ostream::flush();
    }
    this->iter = iVar4;
    pdVar10 = (pointer)Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                       ::linmin(&this->
                                 super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                               );
    this->fret = (Doub)pdVar10;
    if (ABS((double)pdVar10 -
            (double)g.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) +
        ABS((double)pdVar10 -
            (double)g.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) <=
        (ABS((double)g.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) + ABS((double)pdVar10) +
        2.220446049250313e-16) *
        (this->
        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
        ).ftol) {
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"#Convergence met at iteration ",0x1e);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 " because the relative difference in F(p) between 2 consecutive iteration is smaller than "
                 ,0x59);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      poVar5 = std::ostream::_M_insert<double>
                         ((this->
                          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                          ).ftol);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
      goto LAB_00126c72;
    }
    LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
    ::df((this->
         super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
         ).func,(vector<double,_std::allocator<double>_> *)this,this_00);
    if ((int)uVar7 < 1) {
      if (dVar1 <= 0.0) goto LAB_00126bfd;
LAB_00126b84:
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"#Convergence met at iteration ",0x1e);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," because gradient is smaller than ",0x22);
      poVar5 = std::ostream::_M_insert<double>(dVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_00126c54:
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
LAB_00126c72:
      if (local_98 != (undefined1  [8])0x0) {
        operator_delete((void *)local_98);
      }
      if (h.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(h.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      return __return_storage_ptr__;
    }
    pdVar11 = (pointer)0x3ff0000000000000;
    if (1.0 <= (double)pdVar10) {
      pdVar11 = pdVar10;
    }
    uVar6 = 0;
    dVar12 = 0.0;
    do {
      dVar14 = ABS((this->
                   super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                   ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6]);
      dVar13 = 1.0;
      if (1.0 <= dVar14) {
        dVar13 = dVar14;
      }
      dVar13 = (dVar13 * ABS((this->
                             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                             ).xi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6])) / (double)pdVar11;
      if (dVar13 <= dVar12) {
        dVar13 = dVar12;
      }
      uVar6 = uVar6 + 1;
      dVar12 = dVar13;
    } while (uVar8 != uVar6);
    if (dVar13 < dVar1) goto LAB_00126b84;
    if ((int)uVar7 < 1) {
LAB_00126bfd:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"#Convergence met at iteration ",0x1e);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," because the search direction vector is exactly zero",0x34);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      goto LAB_00126c54;
    }
    dVar13 = 0.0;
    uVar6 = 0;
    dVar12 = 0.0;
    do {
      dVar14 = h.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage[uVar6];
      dVar13 = dVar13 + dVar14 * dVar14;
      dVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      dVar12 = dVar12 + (dVar14 + dVar2) * dVar2;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    if ((dVar13 == 0.0) && (!NAN(dVar13))) goto LAB_00126bfd;
    if (0 < (int)uVar7) {
      pdVar11 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = 0;
      do {
        dVar14 = pdVar11[uVar6];
        h.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage[uVar6] = -dVar14;
        dVar14 = *(double *)((long)local_98 + uVar6 * 8) * (dVar12 / dVar13) - dVar14;
        *(double *)((long)local_98 + uVar6 * 8) = dVar14;
        pdVar11[uVar6] = dVar14;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    iVar4 = iVar4 + 1;
    g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar10;
    if (iVar4 == 2000000000) {
      this_01 = (General_Exception *)__cxa_allocate_exception(0x28);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Too many iterations in frprmn","");
      General_Exception::General_Exception(this_01,&local_b8);
      __cxa_throw(this_01,&General_Exception::typeinfo,General_Exception::~General_Exception);
    }
  } while( true );
}

Assistant:

VecDoub minimize(VecDoub_I &pp)
	{
		const Int ITMAX=2000000000;
		const Doub EPS=numeric_limits<Doub>::epsilon();
		const Doub GTOL=ftol;
		Doub gg,dgg;
		Int n=pp.size();
		p=pp;
		VecDoub g(n),h(n);
		xi.resize(n);
		Doub fp=func(p);
		func.df(p,xi);
		for (Int j=0;j<n;j++) {
			g[j] = -xi[j];
			xi[j]=h[j]=g[j];
		}
		for (Int its=0;its<ITMAX;its++) {
		        if(!(its % 100)) {
			  cout << "#At iteration: " << its << " states are:\n";
			  cout.precision(VALMAXDIGITS10); 
			  for(uint i = 0; i < p.size(); ++i) cout << "#\t" << i << "\t" << p[i] << endl;
			  cout.flush();
			}
			iter=its;
			fret=linmin();
			if (2.0*abs(fret-fp) <= ftol*(abs(fret)+abs(fp)+EPS)) {
			  cout.precision(VALMAXDIGITS10);
			  cout << "#Convergence met at iteration " << its << " because the relative difference in F(p) between 2 consecutive iteration is smaller than " << scientific << ftol << endl;
				return p;
			}
			fp=fret;
			func.df(p,xi);
			Doub test=0.0;
			Doub den=MAX(fp, Doub{1.0});
			for (Int j=0;j<n;j++) {
				Doub temp=abs(xi[j])*MAX(abs(p[j]),Doub{1.0})/den;
				if (temp > test) test=temp;
			}
			if (test < GTOL) { 
			  cout.precision(VALMAXDIGITS10); 
			  cout << "#Convergence met at iteration " << its << " because gradient is smaller than " << GTOL << endl;
			  return p;
			}
			dgg=gg=0.0;
			for (Int j=0;j<n;j++) {
				gg += g[j]*g[j];
//			  dgg += xi[j]*xi[j];
				dgg += (xi[j]+g[j])*xi[j];
			}
			if (gg == 0.0) {
			  cout << "#Convergence met at iteration " << its << " because the search direction vector is exactly zero" << endl;
			  return p;
			}
			Doub gam=dgg/gg;
			for (Int j=0;j<n;j++) {
				g[j] = -xi[j];
				xi[j]=h[j]=g[j]+gam*h[j];
			}
		}
		throw(General_Exception("Too many iterations in frprmn"));
	}